

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O2

void FAudio_INTERNAL_ResampleGeneric
               (float *dCache,float *resampleCache,uint64_t *resampleOffset,uint64_t resampleStep,
               uint64_t toResample,uint8_t channels)

{
  uint64_t uVar1;
  uint64_t uVar2;
  undefined7 in_register_00000089;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar1 = *resampleOffset;
  uVar3 = (ulong)(uint)((int)CONCAT71(in_register_00000089,channels) << 2);
  uVar2 = uVar1;
  for (uVar4 = 0; uVar4 < toResample; uVar4 = uVar4 + 1) {
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 4) {
      *(float *)((long)resampleCache + uVar5) =
           (float)((double)(*(float *)((long)dCache + uVar5 + uVar3) -
                           *(float *)((long)dCache + uVar5)) *
                   ((double)(uVar2 & 0xffffffff) * 2.3283064365386963e-10 + 0.0) +
                  (double)*(float *)((long)dCache + uVar5));
    }
    uVar1 = uVar1 + resampleStep;
    *resampleOffset = uVar1;
    uVar2 = (uVar2 & 0xffffffff) + resampleStep;
    dCache = dCache + (uVar2 >> 0x20) * (CONCAT71(in_register_00000089,channels) & 0xffffffff);
    resampleCache = (float *)((long)resampleCache + uVar5);
  }
  return;
}

Assistant:

void FAudio_INTERNAL_ResampleGeneric(
	float *restrict dCache,
	float *restrict resampleCache,
	uint64_t *resampleOffset,
	uint64_t resampleStep,
	uint64_t toResample,
	uint8_t channels
) {
	uint32_t i, j;
	uint64_t cur = *resampleOffset & FIXED_FRACTION_MASK;
	for (i = 0; i < toResample; i += 1)
	{
		for (j = 0; j < channels; j += 1)
		{
			/* lerp, then convert to float value */
			*resampleCache++ = (float) (
				dCache[j] +
				(dCache[j + channels] - dCache[j]) *
				FIXED_TO_DOUBLE(cur)
			);
		}

		/* Increment fraction offset by the stepping value */
		*resampleOffset += resampleStep;
		cur += resampleStep;

		/* Only increment the sample offset by integer values.
		 * Sometimes this will be 0 until cur accumulates
		 * enough steps, especially for "slow" rates.
		 */
		dCache += (cur >> FIXED_PRECISION) * channels;

		/* Now that any integer has been added, drop it.
		 * The offset pointer will preserve the total.
		 */
		cur &= FIXED_FRACTION_MASK;
	}
}